

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O0

void __thiscall
Ptex::v2_4::PtexSeparableKernel::splitL(PtexSeparableKernel *this,PtexSeparableKernel *k)

{
  int iVar1;
  long in_RSI;
  PtexSeparableKernel *in_RDI;
  int w;
  uint in_stack_ffffffffffffffcc;
  Res in_stack_ffffffffffffffd6;
  PtexSeparableKernel *in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffe8;
  Res RVar2;
  
  iVar1 = -in_RDI->u;
  if (iVar1 < in_RDI->uw) {
    RVar2 = in_RDI->res;
    Res::u(&in_RDI->res);
    set((PtexSeparableKernel *)((ulong)in_stack_ffffffffffffffcc << 0x20),in_stack_ffffffffffffffd6,
        (int)((ulong)in_RDI->kv >> 0x20),(int)in_RDI->kv,(int)((ulong)in_RDI->ku >> 0x20),
        (int)in_RDI->ku,(float *)in_RDI,
        (float *)CONCAT44(iVar1,CONCAT22(RVar2,in_stack_ffffffffffffffe8)),(int)in_RSI);
    in_RDI->u = 0;
    in_RDI->uw = in_RDI->uw - iVar1;
    in_RDI->ku = in_RDI->ku + iVar1;
  }
  else {
    operator=(in_RDI,in_stack_ffffffffffffffd8);
    iVar1 = Res::u(&in_RDI->res);
    *(int *)(in_RSI + 4) = iVar1 + *(int *)(in_RSI + 4);
    in_RDI->u = 0;
    in_RDI->uw = 0;
  }
  return;
}

Assistant:

void splitL(PtexSeparableKernel& k)
    {
        // split off left piece of width w into k
        int w = -u;

        if (w < uw) {
            // normal case - split off a portion
            //    res  u          v  uw vw  ku  kv
            k.set(res, res.u()-w, v, w, vw, ku, kv);

            // update local
            u = 0;
            uw -= w;
            ku += w;
        }
        else {
            // entire kernel is split off
            k = *this;
            k.u += res.u();
            u = 0; uw = 0;
        }
    }